

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_xfb_varying.cpp
# Opt level: O3

char * get_field_name(char *name)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  
  pcVar1 = strchr(name,0x2e);
  pcVar2 = strchr(name,0x5b);
  if (pcVar1 == (char *)0x0 && pcVar2 == (char *)0x0) {
    sVar3 = strlen(name);
    iVar4 = (int)sVar3;
  }
  else if (pcVar1 < pcVar2 && pcVar1 != (char *)0x0 || pcVar2 == (char *)0x0) {
    iVar4 = (int)pcVar1 - (int)name;
  }
  else {
    iVar4 = (int)pcVar2 - (int)name;
  }
  pcVar1 = strndup(name,(long)iVar4);
  return pcVar1;
}

Assistant:

static char*
get_field_name(const char *name)
{
   const char *first_dot = strchr(name, '.');
   const char *first_square_bracket = strchr(name, '[');
   int name_size = 0;

   if (!first_square_bracket && !first_dot)
      name_size = strlen(name);
   else if ((!first_square_bracket ||
            (first_dot && first_dot < first_square_bracket)))
      name_size = first_dot - name;
   else
      name_size = first_square_bracket - name;

   return strndup(name, name_size);
}